

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

void whisper_exp_compute_token_level_timestamps
               (whisper_context *ctx,whisper_state *state,int i_segment,float thold_pt,
               float thold_ptsum)

{
  whisper_token *pwVar1;
  char cVar2;
  pointer pfVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  char *__s;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long *plVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  allocator<char> local_99;
  whisper_context *local_98;
  pointer local_90;
  float local_88;
  undefined4 uStack_84;
  whisper_state *local_80;
  int64_t local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  int64_t local_58;
  long local_50;
  long local_48;
  
  _local_88 = CONCAT44(uStack_84,thold_ptsum);
  local_70 = (ulong)((long)(state->energy).super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(state->energy).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  local_98 = ctx;
  if ((int)local_70 == 0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: no signal data available\n",
               "whisper_exp_compute_token_level_timestamps");
    return;
  }
  local_90 = (state->result_all).
             super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
             super__Vector_impl_data._M_start + i_segment;
  lVar23 = *(long *)&(local_90->tokens).
                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                     _M_impl.super__Vector_impl_data;
  local_60 = ((long)*(pointer *)
                     ((long)&(local_90->tokens).
                             super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                             ._M_impl + 8) - lVar23) / 0x38;
  iVar4 = (int)local_60;
  if (iVar4 != 0) {
    local_58 = local_90->t0;
    local_78 = local_90->t1;
    if (iVar4 == 1) {
      *(int64_t *)(lVar23 + 0x18) = local_58;
      *(int64_t *)(lVar23 + 0x20) = local_78;
    }
    else {
      uVar21 = 0;
      local_68 = 0;
      local_80 = state;
      if (0 < iVar4) {
        local_68 = local_60 & 0xffffffff;
      }
      for (; uVar21 != local_68; uVar21 = uVar21 + 1) {
        lVar23 = *(long *)&(local_90->tokens).
                           super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                           ._M_impl.super__Vector_impl_data;
        lVar22 = uVar21 * 0x38;
        pwVar1 = (whisper_token *)(lVar23 + lVar22);
        iVar4 = (local_98->vocab).token_beg;
        iVar15 = *(int *)(lVar23 + lVar22);
        if (uVar21 == 0) {
          if (iVar15 == iVar4) {
            *(int64_t *)(pwVar1 + 6) = local_58;
            *(int64_t *)(pwVar1 + 8) = local_58;
            *(int64_t *)(lVar23 + 0x50) = local_58;
            local_80->t_beg = local_58;
            local_80->t_last = local_58;
            local_80->tid_last = iVar4;
            iVar4 = (local_98->vocab).token_beg;
            iVar15 = *pwVar1;
          }
          else {
            *(int64_t *)(pwVar1 + 6) = local_80->t_last;
          }
        }
        lVar23 = local_80->t_beg;
        iVar14 = pwVar1[1];
        __s = whisper_token_to_str(local_98,iVar15);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_99);
        fVar24 = 0.0;
        for (lVar9 = 0; local_48 != lVar9; lVar9 = lVar9 + 1) {
          cVar2 = *(char *)(local_50 + lVar9);
          fVar25 = 0.01;
          if (cVar2 != ' ') {
            if (((cVar2 == '!') || (cVar2 == '?')) || (cVar2 == '.')) {
              fVar25 = 3.0;
            }
            else if (cVar2 == ',') {
              fVar25 = 2.0;
            }
            else {
              fVar25 = *(float *)(&DAT_0016c188 + (ulong)((byte)(cVar2 - 0x30U) < 10) * 4);
            }
          }
          fVar24 = fVar24 + fVar25;
        }
        *(float *)(*(long *)&(local_90->tokens).
                             super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                             ._M_impl.super__Vector_impl_data + 0x30 + lVar22) = fVar24;
        std::__cxx11::string::~string((string *)&local_50);
        if (((thold_pt < (float)pwVar1[4]) && (local_88 < (float)pwVar1[5])) &&
           ((iVar15 = pwVar1[1], local_80->tid_last < iVar15 &&
            (lVar23 = lVar23 + ((long)iVar14 - (long)iVar4) * 2, lVar23 <= local_78)))) {
          lVar9 = *(long *)&(local_90->tokens).
                            super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                            ._M_impl.super__Vector_impl_data;
          if (uVar21 != 0) {
            *(long *)(lVar9 + -0x18 + lVar22) = lVar23;
          }
          *(long *)(lVar9 + 0x18 + lVar22) = lVar23;
          local_80->tid_last = iVar15;
        }
      }
      iVar4 = (int)local_60;
      lVar23 = *(long *)&(local_90->tokens).
                         super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                         ._M_impl.super__Vector_impl_data;
      *(int64_t *)(lVar23 + 0x20 + (long)(iVar4 + -2) * 0x38) = local_78;
      uVar5 = iVar4 - 1;
      lVar22 = (long)(int)uVar5 * 0x38;
      *(int64_t *)(lVar23 + 0x18 + lVar22) = local_78;
      *(int64_t *)(lVar23 + 0x20 + lVar22) = local_78;
      local_80->t_last = local_78;
      iVar15 = 0;
      do {
        lVar22 = (long)iVar15;
        iVar14 = iVar4;
        if (iVar4 < iVar15) {
          iVar14 = iVar15;
        }
        lVar17 = lVar22 * 0x38;
        plVar18 = (long *)(lVar23 + 0x20 + lVar17);
        for (lVar9 = lVar22; lVar9 < iVar4; lVar9 = lVar9 + 1) {
          if (-1 < *plVar18) {
            iVar14 = (int)lVar9;
            break;
          }
          plVar18 = plVar18 + 7;
        }
        iVar14 = iVar14 - (uint)(iVar4 <= lVar9);
        if (iVar15 < iVar14) {
          lVar19 = (long)iVar14;
          pfVar11 = (float *)(lVar23 + 0x30 + lVar17);
          fVar24 = 0.0;
          for (lVar9 = lVar22; lVar9 <= lVar19; lVar9 = lVar9 + 1) {
            fVar24 = fVar24 + *pfVar11;
            pfVar11 = pfVar11 + 0xe;
          }
          lVar9 = *(long *)(lVar23 + 0x20 + lVar19 * 0x38);
          plVar18 = (long *)(lVar17 + lVar23 + 0x18);
          lVar17 = *plVar18;
          for (; lVar22 < lVar19; lVar22 = lVar22 + 1) {
            lVar12 = (long)((*(float *)(plVar18 + 3) * (float)(lVar9 - lVar17)) / fVar24 +
                           (float)*plVar18);
            plVar18[1] = lVar12;
            plVar18[7] = lVar12;
            plVar18 = plVar18 + 7;
          }
        }
        iVar15 = iVar14 + 1;
      } while (iVar15 < iVar4);
      uVar8 = 0;
      uVar21 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar21 = uVar8;
      }
      for (; uVar21 * 0x38 - uVar8 != 0; uVar8 = uVar8 + 0x38) {
        lVar22 = *(long *)(lVar23 + 0x20 + uVar8);
        if (lVar22 < 0) {
          *(long *)(lVar23 + 0x50 + uVar8) = lVar22;
        }
        if ((uVar8 != 0) &&
           (lVar9 = *(long *)(lVar23 + -0x18 + uVar8), *(long *)(lVar23 + 0x18 + uVar8) < lVar9)) {
          *(long *)(lVar23 + 0x18 + uVar8) = lVar9;
          if (lVar22 < lVar9) {
            lVar22 = lVar9;
          }
          *(long *)(lVar23 + 0x20 + uVar8) = lVar22;
        }
      }
      iVar4 = (int)local_70;
      uVar16 = iVar4 - 1;
      uVar6 = 0;
      if (0 < (int)uVar16) {
        uVar6 = uVar16;
      }
      for (uVar21 = 0; uVar21 != local_68; uVar21 = uVar21 + 1) {
        lVar22 = uVar21 * 0x38;
        if (*(int *)(lVar23 + lVar22) < (local_98->vocab).token_eot) {
          lVar9 = lVar23 + lVar22;
          uVar10 = *(int *)(lVar9 + 0x18) * 0xa0;
          if ((int)uVar16 <= (int)uVar10) {
            uVar10 = uVar16;
          }
          uVar7 = *(int *)(lVar9 + 0x20) * 0xa0;
          if ((int)uVar16 <= (int)uVar7) {
            uVar7 = uVar16;
          }
          uVar20 = 0;
          if (0 < (int)uVar7) {
            uVar20 = uVar7;
          }
          uVar8 = 2000;
          if (2000 < (int)uVar10) {
            uVar8 = (ulong)uVar10;
          }
          iVar15 = uVar20 + 2000;
          if (iVar4 <= (int)(uVar20 + 2000)) {
            iVar15 = iVar4;
          }
          pfVar3 = (local_80->energy).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fVar24 = 0.0;
          for (lVar17 = uVar8 - 2000; lVar17 < iVar15; lVar17 = lVar17 + 1) {
            fVar24 = fVar24 + pfVar3[lVar17];
          }
          uVar13 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar13 = 0;
          }
          fVar24 = (fVar24 * 0.5) / (float)((iVar15 - (int)uVar8) + 2000);
          if ((uVar21 == 0) || (uVar8 = uVar13, pfVar3[uVar13] <= fVar24)) {
            do {
              uVar8 = uVar13 + 1;
              if ((long)(int)uVar7 <= (long)uVar13) break;
              pfVar11 = pfVar3 + uVar13;
              uVar13 = uVar8;
            } while (*pfVar11 <= fVar24 && fVar24 != *pfVar11);
            uVar10 = (int)uVar8 - 1;
            *(ulong *)(lVar9 + 0x18) = (ulong)uVar10 / 0xa0;
          }
          else {
            for (; 0 < (long)uVar8; uVar8 = uVar8 - 1) {
              if (pfVar3[uVar8] <= fVar24) goto LAB_0014f370;
            }
            uVar8 = 0;
LAB_0014f370:
            lVar12 = (long)(int)((long)((ulong)(uint)((int)(uint)uVar8 >> 0x1f) << 0x20 |
                                       uVar8 & 0xffffffff) / 0xa0);
            lVar17 = *(long *)(lVar23 + -0x18 + lVar22);
            lVar19 = lVar12;
            if (lVar12 < lVar17) {
              lVar19 = lVar17;
            }
            *(long *)(lVar9 + 0x18) = lVar19;
            uVar10 = (uint)uVar13;
            if (lVar17 <= lVar12) {
              uVar10 = (uint)uVar8;
            }
          }
          uVar8 = (ulong)uVar20;
          if (pfVar3[uVar8] <= fVar24) {
            do {
              uVar13 = uVar8 - 1;
              if ((long)uVar8 <= (long)(int)uVar10) break;
              pfVar11 = pfVar3 + uVar8;
              uVar8 = uVar13;
            } while (*pfVar11 <= fVar24 && fVar24 != *pfVar11);
            lVar22 = (long)(((int)uVar13 + 1) / 0xa0);
          }
          else {
            for (; (long)uVar8 < (long)(int)uVar16; uVar8 = uVar8 + 1) {
              if (pfVar3[uVar8] <= fVar24) goto LAB_0014f3dd;
            }
            uVar8 = (ulong)uVar6;
LAB_0014f3dd:
            uVar8 = (uVar8 & 0xffffffff) / 0xa0;
            *(ulong *)(lVar9 + 0x20) = uVar8;
            if (((long)(int)uVar5 <= (long)uVar21) ||
               (lVar22 = *(long *)(lVar23 + 0x50 + lVar22), (long)uVar8 <= lVar22))
            goto LAB_0014f400;
          }
          *(long *)(lVar9 + 0x20) = lVar22;
        }
LAB_0014f400:
      }
    }
  }
  return;
}

Assistant:

static void whisper_exp_compute_token_level_timestamps(
        struct whisper_context & ctx,
          struct whisper_state & state,
                           int   i_segment,
                         float   thold_pt,
                         float   thold_ptsum) {
    auto & segment = state.result_all[i_segment];
    auto & tokens  = segment.tokens;

    const int n_samples = state.energy.size();

    if (n_samples == 0) {
        WHISPER_LOG_ERROR("%s: no signal data available\n", __func__);
        return;
    }

    const int64_t t0 = segment.t0;
    const int64_t t1 = segment.t1;

    const int n = tokens.size();

    if (n == 0) {
        return;
    }

    if (n == 1) {
        tokens[0].t0 = t0;
        tokens[0].t1 = t1;

        return;
    }

    auto & t_beg    = state.t_beg;
    auto & t_last   = state.t_last;
    auto & tid_last = state.tid_last;

    for (int j = 0; j < n; ++j) {
        auto & token = tokens[j];

        if (j == 0) {
            if (token.id == whisper_token_beg(&ctx)) {
                tokens[j    ].t0 = t0;
                tokens[j    ].t1 = t0;
                tokens[j + 1].t0 = t0;

                t_beg    = t0;
                t_last   = t0;
                tid_last = whisper_token_beg(&ctx);
            } else {
                tokens[j    ].t0 = t_last;
            }
        }

        const int64_t tt = t_beg + 2*(token.tid - whisper_token_beg(&ctx));

        tokens[j].id    = token.id;
        tokens[j].tid   = token.tid;
        tokens[j].p     = token.p;
        tokens[j].pt    = token.pt;
        tokens[j].ptsum = token.ptsum;

        tokens[j].vlen = voice_length(whisper_token_to_str(&ctx, token.id));

        if (token.pt > thold_pt && token.ptsum > thold_ptsum && token.tid > tid_last && tt <= t1) {
            if (j > 0) {
                tokens[j - 1].t1 = tt;
            }
            tokens[j].t0 = tt;
            tid_last = token.tid;
        }
    }

    tokens[n - 2].t1 = t1;
    tokens[n - 1].t0 = t1;
    tokens[n - 1].t1 = t1;

    t_last = t1;

    // find intervals of tokens with unknown timestamps
    // fill the timestamps by proportionally splitting the interval based on the token voice lengths
    {
        int p0 = 0;
        int p1 = 0;

        while (true) {
            while (p1 < n && tokens[p1].t1 < 0) {
                p1++;
            }

            if (p1 >= n) {
                p1--;
            }

            //printf("p0=%d p1=%d t0=%lld t1=%lld\n", p0, p1, tokens[p0].t0, tokens[p1].t1);

            if (p1 > p0) {
                double psum = 0.0;
                for (int j = p0; j <= p1; j++) {
                    psum += tokens[j].vlen;
                }

                //printf("analyzing %d - %d, psum = %f\n", p0, p1, psum);

                const double dt = tokens[p1].t1 - tokens[p0].t0;

                // split the time proportionally to the voice length
                for (int j = p0 + 1; j <= p1; j++) {
                    const double ct = tokens[j - 1].t0 + dt*tokens[j - 1].vlen/psum;

                    tokens[j - 1].t1 = ct;
                    tokens[j    ].t0 = ct;
                }
            }

            p1++;
            p0 = p1;
            if (p1 >= n) {
                break;
            }
        }
    }

    // fix up (just in case)
    for (int j = 0; j < n - 1; j++) {
        if (tokens[j].t1 < 0) {
            tokens[j + 1].t0 = tokens[j].t1;
        }

        if (j > 0) {
            if (tokens[j - 1].t1 > tokens[j].t0) {
                tokens[j].t0 = tokens[j - 1].t1;
                tokens[j].t1 = std::max(tokens[j].t0, tokens[j].t1);
            }
        }
    }

    // VAD
    // expand or contract tokens based on voice activity
    {
        const int hw = WHISPER_SAMPLE_RATE/8;

        for (int j = 0; j < n; j++) {
            if (tokens[j].id >= whisper_token_eot(&ctx)) {
                continue;
            }

            int s0 = timestamp_to_sample(tokens[j].t0, n_samples);
            int s1 = timestamp_to_sample(tokens[j].t1, n_samples);

            const int ss0 = std::max(s0 - hw, 0);
            const int ss1 = std::min(s1 + hw, n_samples);

            const int ns = ss1 - ss0;

            float sum = 0.0f;

            for (int k = ss0; k < ss1; k++) {
                sum += state.energy[k];
            }

            const float thold = 0.5*sum/ns;

            {
                int k = s0;
                if (state.energy[k] > thold && j > 0) {
                    while (k > 0 && state.energy[k] > thold) {
                        k--;
                    }
                    tokens[j].t0 = sample_to_timestamp(k);
                    if (tokens[j].t0 < tokens[j - 1].t1) {
                        tokens[j].t0 = tokens[j - 1].t1;
                    } else {
                        s0 = k;
                    }
                } else {
                    while (state.energy[k] < thold && k < s1) {
                        k++;
                    }
                    s0 = k;
                    tokens[j].t0 = sample_to_timestamp(k);
                }
            }

            {
                int k = s1;
                if (state.energy[k] > thold) {
                    while (k < n_samples - 1 && state.energy[k] > thold) {
                        k++;
                    }
                    tokens[j].t1 = sample_to_timestamp(k);
                    if (j < n - 1 && tokens[j].t1 > tokens[j + 1].t0) {
                        tokens[j].t1 = tokens[j + 1].t0;
                    } else {
                        s1 = k;
                    }
                } else {
                    while (state.energy[k] < thold && k > s0) {
                        k--;
                    }
                    s1 = k;
                    tokens[j].t1 = sample_to_timestamp(k);
                }
            }
        }
    }

    // fixed token expand (optional)
    //{
    //    const int t_expand = 0;

    //    for (int j = 0; j < n; j++) {
    //        if (j > 0) {
    //            tokens[j].t0 = std::max(0, (int) (tokens[j].t0 - t_expand));
    //        }
    //        if (j < n - 1) {
    //            tokens[j].t1 = tokens[j].t1 + t_expand;
    //        }
    //    }
    //}

    // debug info
    //for (int j = 0; j < n; ++j) {
    //    const auto & token = tokens[j];
    //    const auto tt = token.pt > thold_pt && token.ptsum > 0.01 ? whisper_token_to_str(&ctx, token.tid) : "[?]";
    //    printf("%s: %10s %6.3f %6.3f %6.3f %6.3f %5d %5d '%s'\n", __func__,
    //            tt, token.p, token.pt, token.ptsum, token.vlen, (int) token.t0, (int) token.t1, whisper_token_to_str(&ctx, token.id));

    //    if (tokens[j].id >= whisper_token_eot(&ctx)) {
    //        continue;
    //    }
    //}
}